

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  uint *puVar1;
  uchar uVar2;
  int iVar3;
  size_t __size;
  size_t sVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int *__s;
  int *__s_00;
  unsigned_short *puVar11;
  unsigned_short *puVar12;
  int *__s_01;
  unsigned_short *puVar13;
  ulong uVar14;
  uchar *puVar15;
  uchar *puVar16;
  uint *puVar17;
  uint *puVar18;
  long lVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  size_t sVar23;
  ulong uVar24;
  byte bVar25;
  ulong uVar26;
  ulong uVar27;
  size_t sVar28;
  int iVar29;
  ulong uVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  bool bVar38;
  ucvector v;
  size_t bp;
  ulong local_1c8;
  long local_1c0;
  uivector bitlen_lld_e;
  HuffmanTree tree_ll;
  uivector bitlen_lld;
  uint *local_108;
  HuffmanTree tree_cl;
  HuffmanTree tree_d;
  uivector local_a8;
  uivector lz77_encoded;
  Hash local_60;
  
  v.data = *out;
  v.size = *outsize;
  bp = 0;
  uVar31 = settings->btype;
  uVar8 = 0x3d;
  if (uVar31 < 3) {
    local_1c8 = insize;
    v.allocsize = v.size;
    if (uVar31 != 1) {
      if (uVar31 == 0) {
        if (insize + 0xfffe < 0xffff) {
          uVar8 = 0;
        }
        else {
          uVar20 = (insize + 0xfffe) / 0xffff;
          uVar33 = 0;
          uVar31 = 0;
          do {
            sVar21 = v.size;
            uVar26 = v.size + 1;
            puVar15 = v.data;
            uVar14 = v.allocsize;
            if (v.allocsize < uVar26) {
              uVar14 = uVar26 * 3 >> 1;
              if (v.allocsize * 2 < uVar26) {
                uVar14 = uVar26;
              }
              puVar15 = (uchar *)realloc(v.data,uVar14);
              if (puVar15 != (uchar *)0x0) goto LAB_00107c0f;
            }
            else {
LAB_00107c0f:
              v.allocsize = uVar14;
              v.data = puVar15;
              v.data[sVar21] = uVar33 == uVar20 - 1;
              v.size = uVar26;
            }
            sVar21 = v.size;
            uVar14 = (ulong)uVar31;
            iVar3 = (int)insize - uVar31;
            if (0xfffe < insize - uVar14) {
              iVar3 = 0xffff;
            }
            uVar35 = v.size + 1;
            puVar15 = v.data;
            uVar26 = v.allocsize;
            if (v.allocsize < uVar35) {
              uVar26 = uVar35 * 3 >> 1;
              if (v.allocsize * 2 < uVar35) {
                uVar26 = uVar35;
              }
              puVar15 = (uchar *)realloc(v.data,uVar26);
              if (puVar15 != (uchar *)0x0) goto LAB_00107c89;
            }
            else {
LAB_00107c89:
              v.allocsize = uVar26;
              v.data = puVar15;
              v.data[sVar21] = (uchar)iVar3;
              v.size = uVar35;
            }
            sVar21 = v.size;
            uVar35 = v.size + 1;
            puVar15 = v.data;
            uVar26 = v.allocsize;
            if (v.allocsize < uVar35) {
              uVar26 = uVar35 * 3 >> 1;
              if (v.allocsize * 2 < uVar35) {
                uVar26 = uVar35;
              }
              puVar15 = (uchar *)realloc(v.data,uVar26);
              if (puVar15 != (uchar *)0x0) goto LAB_00107ce3;
            }
            else {
LAB_00107ce3:
              v.allocsize = uVar26;
              v.data = puVar15;
              v.data[sVar21] = (uchar)((uint)iVar3 >> 8);
              v.size = uVar35;
            }
            sVar21 = v.size;
            uVar35 = v.size + 1;
            puVar15 = v.data;
            uVar26 = v.allocsize;
            if (v.allocsize < uVar35) {
              uVar26 = uVar35 * 3 >> 1;
              if (v.allocsize * 2 < uVar35) {
                uVar26 = uVar35;
              }
              puVar15 = (uchar *)realloc(v.data,uVar26);
              if (puVar15 != (uchar *)0x0) goto LAB_00107d40;
            }
            else {
LAB_00107d40:
              v.allocsize = uVar26;
              v.data = puVar15;
              v.data[sVar21] = (uchar)(0xffff - iVar3);
              v.size = uVar35;
            }
            sVar21 = v.size;
            uVar35 = v.size + 1;
            puVar15 = v.data;
            uVar26 = v.allocsize;
            if (v.allocsize < uVar35) {
              uVar26 = uVar35 * 3 >> 1;
              if (v.allocsize * 2 < uVar35) {
                uVar26 = uVar35;
              }
              puVar15 = (uchar *)realloc(v.data,uVar26);
              if (puVar15 != (uchar *)0x0) goto LAB_00107d96;
            }
            else {
LAB_00107d96:
              v.allocsize = uVar26;
              v.data = puVar15;
              v.data[sVar21] = (uchar)((uint)(0xffff - iVar3) >> 8);
              v.size = uVar35;
            }
            if (uVar14 < insize) {
              uVar26 = 0;
              do {
                sVar21 = v.size;
                uVar2 = in[uVar14];
                uVar35 = v.size + 1;
                puVar15 = v.data;
                uVar14 = v.allocsize;
                if (v.allocsize < uVar35) {
                  uVar14 = uVar35 * 3 >> 1;
                  if (v.allocsize * 2 < uVar35) {
                    uVar14 = uVar35;
                  }
                  puVar15 = (uchar *)realloc(v.data,uVar14);
                  if (puVar15 != (uchar *)0x0) goto LAB_00107e02;
                }
                else {
LAB_00107e02:
                  v.allocsize = uVar14;
                  v.data = puVar15;
                  v.data[sVar21] = uVar2;
                  v.size = uVar35;
                }
                uVar35 = uVar26 + 1;
              } while ((uVar26 < 0xfffe) &&
                      (uVar14 = (ulong)(uVar31 + (int)uVar26 + 1), uVar26 = uVar35, uVar14 < insize)
                      );
              uVar31 = uVar31 + (int)uVar35;
            }
            uVar33 = uVar33 + 1;
          } while (uVar33 != uVar20);
          uVar8 = 0;
        }
        goto LAB_00108ea6;
      }
      uVar20 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar20 = insize >> 3;
      }
      if (0x3fff7 < uVar20) {
        uVar20 = 0x3fff8;
      }
      local_1c8 = uVar20 + 8;
    }
    uVar20 = 1;
    if (!CARRY8(insize - 1,local_1c8)) {
      uVar20 = ((insize - 1) + local_1c8) / local_1c8;
    }
    uVar33 = (ulong)settings->windowsize;
    __s = (int *)malloc(0x40000);
    local_60.head = __s;
    __s_00 = (int *)malloc(uVar33 * 4);
    __size = uVar33 * 2;
    local_60.val = __s_00;
    puVar11 = (unsigned_short *)malloc(__size);
    local_60.chain = puVar11;
    puVar12 = (unsigned_short *)malloc(__size);
    local_60.zeros = puVar12;
    __s_01 = (int *)malloc(0x40c);
    local_60.headz = __s_01;
    puVar13 = (unsigned_short *)malloc(__size);
    uVar8 = 0x53;
    local_60.chainz = puVar13;
    if (__s_00 == (int *)0x0) {
      bVar38 = false;
    }
    else if (((__s == (int *)0x0) || (puVar11 == (unsigned_short *)0x0)) ||
            (bVar38 = false, puVar12 == (unsigned_short *)0x0)) {
      bVar38 = false;
    }
    else if ((__s_01 != (int *)0x0) && (puVar13 != (unsigned_short *)0x0)) {
      memset(__s,0xff,0x40000);
      if (uVar33 == 0) {
        memset(__s_01,0xff,0x40c);
      }
      else {
        memset(__s_00,0xff,uVar33 * 4);
        uVar14 = 0;
        do {
          puVar11[uVar14] = (unsigned_short)uVar14;
          uVar14 = uVar14 + 1;
        } while (uVar33 != uVar14);
        memset(__s_01,0xff,0x40c);
        uVar14 = 0;
        do {
          puVar13[uVar14] = (unsigned_short)uVar14;
          uVar14 = uVar14 + 1;
        } while (uVar33 != uVar14);
      }
      uVar8 = 0;
      bVar38 = true;
    }
    if (bVar38) {
      if (uVar20 == 0) {
        uVar8 = 0;
      }
      else {
        lVar34 = 0;
        uVar8 = 0;
        uVar26 = 0;
        uVar14 = local_1c8;
        puVar15 = in;
        uVar33 = local_1c8;
        do {
          uVar35 = uVar14;
          if (insize < uVar14) {
            uVar35 = insize;
          }
          lVar32 = uVar35 + lVar34;
          bVar38 = uVar26 == uVar20 - 1;
          uVar27 = uVar26 * uVar33;
          uVar35 = uVar27 + uVar33;
          if (insize <= uVar27 + uVar33) {
            uVar35 = insize;
          }
          if (settings->btype == 2) {
            lz77_encoded.data = (uint *)0x0;
            lz77_encoded.size = 0;
            lz77_encoded.allocsize = 0;
            tree_ll.tree2d = (uint *)0x0;
            tree_ll.tree1d = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_d.tree2d = (uint *)0x0;
            tree_d.tree1d = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            tree_cl.tree2d = (uint *)0x0;
            tree_cl.tree1d = (uint *)0x0;
            tree_cl.lengths = (uint *)0x0;
            bitlen_lld.data = (uint *)0x0;
            bitlen_lld.size = 0;
            bitlen_lld.allocsize = 0;
            bitlen_lld_e.data = (uint *)0x0;
            bitlen_lld_e.size = 0;
            bitlen_lld_e.allocsize = 0;
            local_a8.data = (uint *)0x0;
            local_a8.size = 0;
            local_a8.allocsize = 0;
            if (settings->use_lz77 == 0) {
              uVar31 = uivector_resize(&lz77_encoded,uVar35 - uVar27);
              if (uVar31 != 0) {
                if (uVar27 < uVar35) {
                  lVar19 = 0;
                  do {
                    lz77_encoded.data[lVar19] = (uint)puVar15[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar32 != lVar19);
                }
                goto LAB_0010831b;
              }
              uVar8 = 0x53;
LAB_00108505:
              puVar17 = (uint *)0x0;
              local_108 = (uint *)0x0;
LAB_0010851c:
              puVar18 = (uint *)0x0;
            }
            else {
              uVar8 = encodeLZ77(&lz77_encoded,&local_60,in,uVar27,uVar35,settings->windowsize,
                                 settings->minmatch,settings->nicematch,settings->lazymatching);
              if (uVar8 != 0) goto LAB_00108505;
LAB_0010831b:
              local_1c0 = lVar34;
              puVar17 = (uint *)malloc(0x478);
              uVar31 = 0x53;
              uVar8 = uVar31;
              if (puVar17 != (uint *)0x0) {
                memset(puVar17,0,0x478);
                local_108 = (uint *)malloc(0x78);
                if (local_108 == (uint *)0x0) goto LAB_001084f6;
                local_108[0x18] = 0;
                local_108[0x19] = 0;
                local_108[0x1a] = 0;
                local_108[0x1b] = 0;
                local_108[0x14] = 0;
                local_108[0x15] = 0;
                local_108[0x16] = 0;
                local_108[0x17] = 0;
                local_108[0x10] = 0;
                local_108[0x11] = 0;
                local_108[0x12] = 0;
                local_108[0x13] = 0;
                local_108[0xc] = 0;
                local_108[0xd] = 0;
                local_108[0xe] = 0;
                local_108[0xf] = 0;
                local_108[8] = 0;
                local_108[9] = 0;
                local_108[10] = 0;
                local_108[0xb] = 0;
                local_108[4] = 0;
                local_108[5] = 0;
                local_108[6] = 0;
                local_108[7] = 0;
                local_108[0] = 0;
                local_108[1] = 0;
                local_108[2] = 0;
                local_108[3] = 0;
                local_108[0x1c] = 0;
                local_108[0x1d] = 0;
                if (lz77_encoded.size != 0) {
                  sVar21 = 0;
                  do {
                    uVar8 = lz77_encoded.data[sVar21];
                    puVar17[uVar8] = puVar17[uVar8] + 1;
                    if (0x100 < (ulong)uVar8) {
                      local_108[lz77_encoded.data[sVar21 + 2]] =
                           local_108[lz77_encoded.data[sVar21 + 2]] + 1;
                      sVar21 = sVar21 + 3;
                    }
                    sVar21 = sVar21 + 1;
                  } while (sVar21 != lz77_encoded.size);
                }
                puVar17[0x100] = 1;
                uVar8 = HuffmanTree_makeFromFrequencies(&tree_ll,puVar17,0x101,0x11e,0xf);
                if (uVar8 != 0) goto LAB_001084f6;
                uVar8 = HuffmanTree_makeFromFrequencies(&tree_d,local_108,2,0x1e,0xf);
                uVar10 = tree_d.numcodes;
                puVar18 = tree_ll.lengths;
                lVar34 = local_1c0;
                if (uVar8 == 0) {
                  uVar35 = 0x11e;
                  if (tree_ll.numcodes < 0x11e) {
                    uVar35 = (ulong)tree_ll.numcodes;
                  }
                  uVar27 = 0x1e;
                  if (tree_d.numcodes < 0x1e) {
                    uVar27 = (ulong)tree_d.numcodes;
                  }
                  if (tree_ll.numcodes != 0) {
                    uVar33 = 0;
                    do {
                      uVar8 = puVar18[uVar33];
                      uVar9 = uivector_resize(&bitlen_lld,bitlen_lld.size + 1);
                      if (uVar9 != 0) {
                        bitlen_lld.data[bitlen_lld.size - 1] = uVar8;
                      }
                      uVar33 = uVar33 + 1;
                    } while (uVar35 != uVar33);
                  }
                  puVar18 = tree_d.lengths;
                  if (uVar10 != 0) {
                    uVar33 = 0;
                    do {
                      uVar8 = puVar18[uVar33];
                      uVar10 = uivector_resize(&bitlen_lld,bitlen_lld.size + 1);
                      if (uVar10 != 0) {
                        bitlen_lld.data[bitlen_lld.size - 1] = uVar8;
                      }
                      uVar33 = uVar33 + 1;
                    } while (uVar27 != uVar33);
                  }
                  puVar18 = bitlen_lld.data;
                  uVar33 = bitlen_lld.size & 0xffffffff;
                  if (uVar33 != 0) {
                    uVar30 = 0;
                    do {
                      uVar36 = uVar30 + 1;
                      uVar24 = 0;
                      if (uVar36 < uVar33) {
                        uVar24 = 0;
                        uVar22 = uVar36;
                        do {
                          if (puVar18[uVar22] != puVar18[uVar30]) break;
                          uVar24 = (ulong)((int)uVar24 + 1);
                          uVar22 = uVar36 + uVar24;
                        } while (uVar22 < uVar33);
                      }
                      uVar8 = puVar18[uVar30];
                      uVar10 = (uint)uVar24;
                      if ((uVar10 < 2) || (uVar8 != 0)) {
                        if (2 < uVar10) {
                          uVar9 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                          if (uVar9 != 0) {
                            bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar8;
                          }
                          uVar36 = uVar24 / 6;
                          if (5 < uVar10) {
                            do {
                              uVar8 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar8 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x10;
                              }
                              uVar8 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar8 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = 3;
                              }
                              uVar36 = uVar36 - 1;
                            } while (uVar36 != 0);
                          }
                          uVar8 = uVar10 + (int)(uVar24 / 6) * -6;
                          if (uVar8 < 3) {
                            uVar24 = (ulong)(uVar10 - uVar8);
                          }
                          else {
                            uVar10 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                            if (uVar10 != 0) {
                              bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x10;
                            }
                            uVar10 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                            if (uVar10 != 0) {
                              bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar8 - 3;
                            }
                          }
                          goto LAB_001089f7;
                        }
                        uVar10 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                        if (uVar10 != 0) {
                          bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar8;
                        }
                      }
                      else {
                        uVar8 = uVar10 + 1;
                        if (uVar8 < 0xb) {
                          uVar8 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                          if (uVar8 != 0) {
                            bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x11;
                          }
                          uVar8 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                          if (uVar8 != 0) {
                            bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar10 - 2;
                          }
                        }
                        else {
                          if (0x89 < uVar8) {
                            uVar8 = 0x8a;
                          }
                          uVar10 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                          if (uVar10 != 0) {
                            bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x12;
                          }
                          uVar10 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                          if (uVar10 != 0) {
                            bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar8 - 0xb;
                          }
                          uVar24 = (ulong)(uVar8 - 1);
                        }
LAB_001089f7:
                        uVar30 = uVar30 + uVar24;
                      }
                      uVar30 = uVar30 + 1;
                    } while (uVar30 != uVar33);
                  }
                  uVar33 = local_1c8;
                  puVar18 = (uint *)malloc(0x4c);
                  sVar21 = bitlen_lld_e.size;
                  lVar34 = local_1c0;
                  uVar8 = uVar31;
                  if (puVar18 != (uint *)0x0) {
                    puVar18[0xf] = 0;
                    puVar18[0x10] = 0;
                    puVar18[0x11] = 0;
                    puVar18[0x12] = 0;
                    puVar18[0xc] = 0;
                    puVar18[0xd] = 0;
                    puVar18[0xe] = 0;
                    puVar18[0xf] = 0;
                    puVar18[8] = 0;
                    puVar18[9] = 0;
                    puVar18[10] = 0;
                    puVar18[0xb] = 0;
                    puVar18[4] = 0;
                    puVar18[5] = 0;
                    puVar18[6] = 0;
                    puVar18[7] = 0;
                    puVar18[0] = 0;
                    puVar18[1] = 0;
                    puVar18[2] = 0;
                    puVar18[3] = 0;
                    if (bitlen_lld_e.size != 0) {
                      sVar23 = 0;
                      do {
                        uVar8 = bitlen_lld_e.data[sVar23];
                        puVar18[uVar8] = puVar18[uVar8] + 1;
                        sVar23 = (sVar23 - ((ulong)uVar8 < 0x10)) + 2;
                      } while (sVar23 != bitlen_lld_e.size);
                    }
                    uVar8 = HuffmanTree_makeFromFrequencies(&tree_cl,puVar18,0x13,0x13,7);
                    lVar34 = local_1c0;
                    if (uVar8 == 0) {
                      uVar30 = (ulong)tree_cl.numcodes;
                      uVar10 = uivector_resize(&local_a8,uVar30);
                      lVar34 = local_1c0;
                      uVar8 = uVar31;
                      if (uVar10 != 0) {
                        if (uVar30 != 0) {
                          lVar34 = 0;
                          do {
                            *(uint *)((long)local_a8.data + lVar34) =
                                 tree_cl.lengths[*(uint *)((long)CLCL_ORDER + lVar34)];
                            lVar34 = lVar34 + 4;
                          } while (uVar30 << 2 != lVar34);
                        }
                        do {
                          uVar31 = local_a8.data[local_a8.size - 1];
                          bVar37 = local_a8.size < 5;
                          if (bVar37 || uVar31 != 0) {
                            uVar8 = 0;
                            goto LAB_00108b65;
                          }
                          uVar8 = uivector_resize(&local_a8,local_a8.size - 1);
                        } while (uVar8 != 0);
                        uVar8 = 0x53;
LAB_00108b65:
                        sVar4 = bp;
                        sVar23 = v.size;
                        lVar34 = local_1c0;
                        if (bVar37 || uVar31 != 0) {
                          if ((bp & 7) == 0) {
                            sVar28 = v.size + 1;
                            uVar31 = ucvector_reserve(&v,sVar28);
                            if (uVar31 != 0) {
                              v.data[sVar23] = '\0';
                              v.size = sVar28;
                            }
                          }
                          sVar23 = v.size;
                          v.data[v.size - 1] = v.data[v.size - 1] | bVar38 << ((byte)sVar4 & 7);
                          bp = sVar4 + 1;
                          if ((bp & 7) == 0) {
                            sVar28 = v.size + 1;
                            uVar31 = ucvector_reserve(&v,sVar28);
                            if (uVar31 != 0) {
                              v.data[sVar23] = '\0';
                              v.size = sVar28;
                            }
                          }
                          sVar23 = v.size;
                          bp = sVar4 + 2;
                          bVar25 = (byte)bp;
                          if ((bp & 7) == 0) {
                            sVar28 = v.size + 1;
                            uVar31 = ucvector_reserve(&v,sVar28);
                            if (uVar31 != 0) {
                              v.data[sVar23] = '\0';
                              v.size = sVar28;
                            }
                          }
                          puVar5 = local_a8.data;
                          v.data[v.size - 1] = v.data[v.size - 1] | '\x01' << (bVar25 & 7);
                          bp = sVar4 + 3;
                          iVar3 = (int)local_a8.size;
                          uVar30 = (ulong)(iVar3 - 4) + 3;
                          uVar33 = 0;
                          do {
                            uVar36 = uVar33;
                            if (uVar36 == iVar3 - 4) break;
                            uVar24 = uVar30 & 0xffffffff;
                            uVar30 = uVar30 - 1;
                            uVar33 = uVar36 + 1;
                          } while (local_a8.data[uVar24] == 0);
                          iVar29 = (int)(uVar36 + 1);
                          addBitsToStream(&bp,&v,(int)uVar35 - 0x101,5);
                          addBitsToStream(&bp,&v,(int)uVar27 - 1,5);
                          addBitsToStream(&bp,&v,(iVar3 - iVar29) - 3,4);
                          if (iVar3 + 1 != iVar29) {
                            uVar33 = 0;
                            do {
                              addBitsToStream(&bp,&v,puVar5[uVar33],3);
                              uVar33 = uVar33 + 1;
                            } while ((uint)(iVar3 - (int)uVar36) != uVar33);
                          }
                          puVar7 = tree_cl.lengths;
                          puVar6 = tree_cl.tree1d;
                          puVar5 = bitlen_lld_e.data;
                          if (sVar21 != 0) {
                            sVar23 = 0;
                            do {
                              addHuffmanSymbol(&bp,&v,puVar6[puVar5[sVar23]],puVar7[puVar5[sVar23]])
                              ;
                              puVar1 = puVar5 + sVar23;
                              if (*puVar1 - 0x10 < 3) {
                                lVar34 = sVar23 + 1;
                                sVar23 = sVar23 + 1;
                                addBitsToStream(&bp,&v,puVar5[lVar34],
                                                *(size_t *)
                                                 (&DAT_001139b0 + (ulong)(*puVar1 - 0x10) * 8));
                              }
                              sVar23 = sVar23 + 1;
                            } while (sVar23 != sVar21);
                          }
                          writeLZ77data(&bp,&v,&lz77_encoded,&tree_ll,&tree_d);
                          if (tree_ll.lengths[0x100] == 0) {
                            lVar34 = local_1c0;
                            uVar33 = local_1c8;
                            uVar8 = 0x40;
                          }
                          else {
                            addHuffmanSymbol(&bp,&v,tree_ll.tree1d[0x100],tree_ll.lengths[0x100]);
                            lVar34 = local_1c0;
                            uVar33 = local_1c8;
                            uVar8 = 0;
                          }
                        }
                      }
                    }
                  }
                  goto LAB_0010851f;
                }
                goto LAB_0010851c;
              }
              local_108 = (uint *)0x0;
LAB_001084f6:
              puVar18 = (uint *)0x0;
              lVar34 = local_1c0;
            }
LAB_0010851f:
            lz77_encoded.size = 0;
            lz77_encoded.allocsize = 0;
            free(lz77_encoded.data);
            lz77_encoded.data = (uint *)0x0;
            free(tree_ll.tree2d);
            free(tree_ll.tree1d);
            free(tree_ll.lengths);
            free(tree_d.tree2d);
            free(tree_d.tree1d);
            free(tree_d.lengths);
            free(tree_cl.tree2d);
            free(tree_cl.tree1d);
            free(tree_cl.lengths);
            free(puVar17);
            free(local_108);
            free(puVar18);
            bitlen_lld_e.size = 0;
            bitlen_lld_e.allocsize = 0;
            free(bitlen_lld_e.data);
            bitlen_lld_e.data = (uint *)0x0;
            bitlen_lld.size = 0;
            bitlen_lld.allocsize = 0;
            free(bitlen_lld.data);
            bitlen_lld.data = (uint *)0x0;
            local_a8.size = 0;
            local_a8.allocsize = 0;
            free(local_a8.data);
          }
          else if (settings->btype == 1) {
            tree_ll.tree2d = (uint *)0x0;
            tree_ll.tree1d = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_d.tree2d = (uint *)0x0;
            tree_d.tree1d = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            local_1c0 = lVar34;
            generateFixedLitLenTree(&tree_ll);
            generateFixedDistanceTree(&tree_d);
            sVar23 = bp;
            sVar21 = v.size;
            if ((bp & 7) == 0) {
              uVar30 = v.size + 1;
              puVar16 = v.data;
              uVar33 = v.allocsize;
              if (v.allocsize < uVar30) {
                uVar33 = uVar30 * 3 >> 1;
                if (v.allocsize * 2 < uVar30) {
                  uVar33 = uVar30;
                }
                puVar16 = (uchar *)realloc(v.data,uVar33);
                if (puVar16 == (uchar *)0x0) goto LAB_00107fd8;
              }
              v.allocsize = uVar33;
              v.data = puVar16;
              v.data[sVar21] = '\0';
              v.size = uVar30;
            }
LAB_00107fd8:
            sVar21 = v.size;
            v.data[v.size - 1] = v.data[v.size - 1] | bVar38 << ((byte)sVar23 & 7);
            bp = sVar23 + 1;
            bVar25 = (byte)bp;
            if ((bp & 7) == 0) {
              uVar30 = v.size + 1;
              puVar16 = v.data;
              uVar33 = v.allocsize;
              if (v.allocsize < uVar30) {
                uVar33 = uVar30 * 3 >> 1;
                if (v.allocsize * 2 < uVar30) {
                  uVar33 = uVar30;
                }
                puVar16 = (uchar *)realloc(v.data,uVar33);
                if (puVar16 == (uchar *)0x0) goto LAB_0010805f;
              }
              v.allocsize = uVar33;
              v.data = puVar16;
              v.data[sVar21] = '\0';
              v.size = uVar30;
            }
LAB_0010805f:
            sVar21 = v.size;
            v.data[v.size - 1] = v.data[v.size - 1] | '\x01' << (bVar25 & 7);
            bp = sVar23 + 2;
            if ((bp & 7) == 0) {
              uVar30 = v.size + 1;
              puVar16 = v.data;
              uVar33 = v.allocsize;
              if (v.allocsize < uVar30) {
                uVar33 = uVar30 * 3 >> 1;
                if (v.allocsize * 2 < uVar30) {
                  uVar33 = uVar30;
                }
                puVar16 = (uchar *)realloc(v.data,uVar33);
                if (puVar16 == (uchar *)0x0) goto LAB_001080dd;
              }
              v.allocsize = uVar33;
              v.data = puVar16;
              v.data[sVar21] = '\0';
              v.size = uVar30;
            }
LAB_001080dd:
            puVar18 = tree_ll.lengths;
            puVar17 = tree_ll.tree1d;
            bp = sVar23 + 3;
            if (settings->use_lz77 == 0) {
              uVar8 = 0;
              lVar34 = local_1c0;
              uVar33 = local_1c8;
              if (uVar27 < uVar35) {
                lVar34 = 0;
                do {
                  addHuffmanSymbol(&bp,&v,puVar17[puVar15[lVar34]],puVar18[puVar15[lVar34]]);
                  lVar34 = lVar34 + 1;
                } while (lVar32 != lVar34);
                uVar8 = 0;
                lVar34 = local_1c0;
                uVar33 = local_1c8;
              }
            }
            else {
              tree_cl.tree2d = (uint *)0x0;
              tree_cl.tree1d = (uint *)0x0;
              tree_cl.lengths = (uint *)0x0;
              uVar8 = encodeLZ77((uivector *)&tree_cl,&local_60,in,uVar27,uVar35,
                                 settings->windowsize,settings->minmatch,settings->nicematch,
                                 settings->lazymatching);
              lVar34 = local_1c0;
              uVar33 = local_1c8;
              if (uVar8 == 0) {
                writeLZ77data(&bp,&v,(uivector *)&tree_cl,&tree_ll,&tree_d);
              }
              tree_cl.tree1d = (uint *)0x0;
              tree_cl.lengths = (uint *)0x0;
              free(tree_cl.tree2d);
            }
            if (uVar8 == 0) {
              addHuffmanSymbol(&bp,&v,tree_ll.tree1d[0x100],tree_ll.lengths[0x100]);
            }
            free(tree_ll.tree2d);
            free(tree_ll.tree1d);
            free(tree_ll.lengths);
            free(tree_d.tree2d);
            free(tree_d.tree1d);
            free(tree_d.lengths);
          }
          uVar26 = uVar26 + 1;
          if (uVar26 == uVar20) break;
          uVar14 = uVar14 + uVar33;
          lVar34 = lVar34 - uVar33;
          puVar15 = puVar15 + uVar33;
        } while (uVar8 == 0);
      }
      free(local_60.head);
      free(local_60.val);
      free(local_60.chain);
      free(local_60.zeros);
      free(local_60.headz);
      free(local_60.chainz);
    }
  }
LAB_00108ea6:
  *out = v.data;
  *outsize = v.size;
  return uVar8;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGCompressSettings* settings)
{
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}